

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O0

taylor<double,_2,_10> * binomial_generating_function<double,10>(void)

{
  taylor<double,_2,_10> *in_RDI;
  int local_a74;
  taylor<double,_2,_10> local_a70;
  taylor<double,_2,_10> local_860;
  int local_64c;
  taylor<double,_2,_10> local_648;
  int local_438 [2];
  undefined1 local_430 [8];
  taylor<double,_2,_10> y;
  undefined1 local_218 [8];
  taylor<double,_2,_10> x;
  
  y.super_polynomial<double,_2,_10>.c[0x41]._4_4_ = 0;
  taylor<double,_2,_10>::taylor<int>
            ((taylor<double,_2,_10> *)local_218,
             (int *)((long)y.super_polynomial<double,_2,_10>.c + 0x20c),0);
  local_438[1] = 0;
  taylor<double,_2,_10>::taylor<int>((taylor<double,_2,_10> *)local_430,local_438 + 1,1);
  local_438[0] = 1;
  local_64c = 1;
  local_a74 = 1;
  operator+(&local_a70,&local_a74,(taylor<double,_2,_10> *)local_218);
  operator*(&local_860,&local_a70,(taylor<double,_2,_10> *)local_430);
  operator-(&local_648,&local_64c,&local_860);
  operator/(in_RDI,local_438,&local_648);
  return in_RDI;
}

Assistant:

taylor<T, 2, N> binomial_generating_function() {
  taylor<T, 2, N> x(0, 0), y(0, 1);
  return 1 / (1 - (1 + x) * y); // generating function for the binomial coefficients
}